

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O1

bool __thiscall
cmFindBase::ParseArguments
          (cmFindBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn)

{
  cmMakefile *this_00;
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string_view name;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  optional<cmWindowsRegistry::View> oVar6;
  cmState *this_01;
  string *psVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  long *plVar9;
  value_type *pvVar10;
  uint uVar11;
  uint uVar12;
  cmFindBase *this_02;
  anon_class_8_1_d1845f1d_for__M_pred __pred;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar13;
  undefined4 uVar14;
  ulong uVar15;
  cmFindCommon *this_03;
  bool bVar16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string_view separator;
  Command command;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  cmList macros;
  _Any_data local_f8;
  _Alloc_hider in_stack_ffffffffffffff18;
  _Alloc_hider _Var17;
  char *in_stack_ffffffffffffff20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined8 local_c8;
  cmFindCommon *local_c0;
  undefined1 local_b8 [32];
  string *local_98;
  cmFindBase *local_90;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  string *local_50;
  cmList local_48;
  
  uVar15 = (long)(argsIn->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(argsIn->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar15 < 2) {
    local_f8._M_unused._M_object = &stack0xffffffffffffff18;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"called with incorrect number of arguments","");
    cmFindCommon::SetError(&this->super_cmFindCommon,(string *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != &stack0xffffffffffffff18) {
      operator_delete(local_f8._M_unused._M_object,(ulong)(in_stack_ffffffffffffff18._M_p + 1));
    }
    bVar3 = false;
  }
  else {
    local_d8._M_allocated_capacity = 0;
    local_d8._8_8_ = 0;
    local_c8 = 0;
    local_98 = (string *)&this->VariableDocumentation;
    uVar5 = 0;
    bVar3 = false;
    uVar12 = 0;
    local_90 = this;
    do {
      if ((bVar3) ||
         (iVar4 = std::__cxx11::string::compare
                            ((char *)((argsIn->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar5)),
         iVar4 != 0)) {
        iVar4 = std::__cxx11::string::compare
                          ((char *)((argsIn->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar5));
        if (iVar4 == 0) {
          local_90->StoreResultInCache = false;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((argsIn->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar5));
          if (iVar4 == 0) {
            uVar11 = uVar12 + 1;
            if (uVar11 < uVar15) {
              cmsys::SystemTools::GetPath
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_d8,
                         (argsIn->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p);
              uVar12 = uVar11;
            }
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_d8,
                        (argsIn->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar5);
          }
        }
      }
      else if (uVar12 + 1 < uVar15) {
        bVar3 = true;
        std::__cxx11::string::_M_assign(local_98);
        uVar12 = uVar12 + 1;
      }
      this_02 = local_90;
      uVar12 = uVar12 + 1;
      uVar5 = (ulong)uVar12;
    } while (uVar5 < uVar15);
    if ((ulong)(local_d8._8_8_ - local_d8._0_8_) < 0x21) {
      local_f8._M_unused._M_object = (value_type *)&stack0xffffffffffffff18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"called with incorrect number of arguments","");
      cmFindCommon::SetError(&local_90->super_cmFindCommon,(string *)&local_f8);
      if ((value_type *)local_f8._M_unused._0_8_ != (value_type *)&stack0xffffffffffffff18) {
LAB_006a369f:
        operator_delete(local_f8._M_unused._M_object,(ulong)(in_stack_ffffffffffffff18._M_p + 1));
      }
LAB_006a36ac:
      bVar3 = false;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_90->VariableName);
      bVar3 = CheckForVariableDefined(this_02);
      if (bVar3) {
        this_02->AlreadyDefined = true;
        bVar3 = true;
      }
      else {
        this_03 = &this_02->super_cmFindCommon;
        cmFindCommon::SelectDefaultSearchModes(this_03);
        cmFindCommon::SelectDefaultRootPathMode(this_03);
        cmFindCommon::SelectDefaultMacMode(this_03);
        bVar3 = (ulong)(local_d8._8_8_ - local_d8._0_8_) < 0x21;
        if (bVar3) {
          bVar16 = false;
        }
        else {
          local_58 = &(this_02->super_cmFindCommon).UserGuessArgs;
          local_60 = &this_02->Names;
          local_50 = (string *)&this_02->ValidatorName;
          uVar14 = 1;
          bVar16 = false;
          uVar15 = 1;
          local_c0 = this_03;
          do {
            uVar12 = (uint)uVar15;
            lVar13 = uVar15 * 0x20;
            iVar4 = std::__cxx11::string::compare((char *)(local_d8._M_allocated_capacity + lVar13))
            ;
            if (iVar4 == 0) {
              uVar14 = 1;
LAB_006a38c8:
              bVar16 = true;
            }
            else {
              iVar4 = std::__cxx11::string::compare
                                ((char *)(local_d8._M_allocated_capacity + lVar13));
              if (iVar4 == 0) {
                uVar14 = 2;
                goto LAB_006a38c8;
              }
              iVar4 = std::__cxx11::string::compare
                                ((char *)(local_d8._M_allocated_capacity + lVar13));
              if (iVar4 == 0) {
                uVar14 = 4;
                goto LAB_006a38c8;
              }
              iVar4 = std::__cxx11::string::compare
                                ((char *)(local_d8._M_allocated_capacity + lVar13));
              if (iVar4 == 0) {
                uVar14 = 3;
                goto LAB_006a38c8;
              }
              iVar4 = std::__cxx11::string::compare
                                ((char *)(local_d8._M_allocated_capacity + lVar13));
              if (iVar4 == 0) {
                if (this_02->NamesPerDirAllowed != true) {
                  local_f8._M_unused._M_object = &stack0xffffffffffffff18;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_f8,"does not support NAMES_PER_DIR","");
                  cmFindCommon::SetError(local_c0,(string *)&local_f8);
                  goto LAB_006a3edb;
                }
                this_02->NamesPerDir = true;
LAB_006a390e:
                uVar14 = 0;
              }
              else {
                iVar4 = std::__cxx11::string::compare
                                  ((char *)(local_d8._M_allocated_capacity + lVar13));
                if (iVar4 == 0) {
                  (this_02->super_cmFindCommon).NoDefaultPath = true;
                  goto LAB_006a390e;
                }
                iVar4 = std::__cxx11::string::compare
                                  ((char *)(local_d8._M_allocated_capacity + lVar13));
                if (iVar4 == 0) {
                  this_02->Required = true;
                  uVar14 = 0;
                  goto LAB_006a38c8;
                }
                iVar4 = std::__cxx11::string::compare
                                  ((char *)(local_d8._M_allocated_capacity + lVar13));
                if (iVar4 == 0) {
                  uVar12 = uVar12 + 1;
                  if ((long)(local_d8._8_8_ - local_d8._0_8_) >> 5 == (ulong)uVar12) {
                    local_f8._M_unused._M_object = &stack0xffffffffffffff18;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_f8,"missing required argument for \"REGISTRY_VIEW\""
                               ,"");
                    cmFindCommon::SetError(local_c0,(string *)&local_f8);
LAB_006a3edb:
                    if ((value_type *)local_f8._M_unused._0_8_ ==
                        (value_type *)&stack0xffffffffffffff18) goto LAB_006a36ac;
                    goto LAB_006a369f;
                  }
                  name._M_str = in_stack_ffffffffffffff20;
                  name._M_len = (size_t)in_stack_ffffffffffffff18._M_p;
                  oVar6 = cmWindowsRegistry::ToView(name);
                  if (((ulong)oVar6.super__Optional_base<cmWindowsRegistry::View,_true,_true>.
                              _M_payload.super__Optional_payload_base<cmWindowsRegistry::View> >>
                       0x20 & 1) == 0) {
                    cmStrCat<char_const(&)[42],std::__cxx11::string&>
                              ((string *)&local_f8,
                               (char (*) [42])"given invalid value for \"REGISTRY_VIEW\": ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((ulong)uVar12 * 0x20 + local_d8._M_allocated_capacity));
                    cmFindCommon::SetError(local_c0,(string *)&local_f8);
                    if ((value_type *)local_f8._M_unused._0_8_ !=
                        (value_type *)&stack0xffffffffffffff18) {
                      operator_delete(local_f8._M_unused._M_object,
                                      (ulong)(in_stack_ffffffffffffff18._M_p + 1));
                    }
                  }
                  else {
                    (local_90->super_cmFindCommon).RegistryView =
                         oVar6.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
                         super__Optional_payload_base<cmWindowsRegistry::View>._M_payload;
                  }
                  this_02 = local_90;
                  if (((ulong)oVar6.super__Optional_base<cmWindowsRegistry::View,_true,_true>.
                              _M_payload.super__Optional_payload_base<cmWindowsRegistry::View> >>
                       0x20 & 1) == 0) goto LAB_006a36ac;
                }
                else {
                  iVar4 = std::__cxx11::string::compare
                                    ((char *)(local_d8._M_allocated_capacity + lVar13));
                  if (iVar4 == 0) {
                    uVar12 = uVar12 + 1;
                    if ((long)(local_d8._8_8_ - local_d8._0_8_) >> 5 == (ulong)uVar12) {
                      local_f8._M_unused._M_object = &stack0xffffffffffffff18;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f8,"missing required argument for \"VALIDATOR\"",
                                 "");
                      cmFindCommon::SetError(local_c0,(string *)&local_f8);
                      goto LAB_006a3edb;
                    }
                    this_01 = cmMakefile::GetState((this_02->super_cmFindCommon).Makefile);
                    lVar13 = (ulong)uVar12 * 0x20;
                    cmState::GetCommand((Command *)&local_f8,this_01,
                                        (string *)(local_d8._M_allocated_capacity + lVar13));
                    if ((code *)in_stack_ffffffffffffff18._M_p == (code *)0x0) {
                      local_88._M_dataplus._M_p._0_1_ = 0x2e;
                      cmStrCat<char_const(&)[49],std::__cxx11::string&,char>
                                ((string *)local_b8,
                                 (char (*) [49])"command specified for \"VALIDATOR\" is undefined: "
                                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(lVar13 + local_d8._M_allocated_capacity),(char *)&local_88);
                      cmFindCommon::SetError(local_c0,(string *)local_b8);
                      if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
                        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
                      }
                      if ((code *)in_stack_ffffffffffffff18._M_p != (code *)0x0) {
                        (*(code *)in_stack_ffffffffffffff18._M_p)(&local_f8,&local_f8,3);
                      }
                      goto LAB_006a36ac;
                    }
                    __pred.validatorName = (value_type *)(local_d8._M_allocated_capacity + lVar13);
                    this_00 = (this_02->super_cmFindCommon).Makefile;
                    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"MACROS","")
                    ;
                    psVar7 = (string *)cmMakefile::GetProperty(this_00,&local_88);
                    if (psVar7 == (string *)0x0) {
                      psVar7 = &cmValue::Empty_abi_cxx11_;
                    }
                    local_b8._0_8_ = local_b8 + 0x10;
                    pcVar1 = (psVar7->_M_dataplus)._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_b8,pcVar1,pcVar1 + psVar7->_M_string_length);
                    init._M_len = 1;
                    init._M_array = (iterator)local_b8;
                    cmList::cmList(&local_48,init);
                    if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
                      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_88._M_dataplus._M_p != &local_88.field_2) {
                      operator_delete(local_88._M_dataplus._M_p,
                                      local_88.field_2._M_allocated_capacity + 1);
                    }
                    _Var8 = std::
                            find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )local_48.Values.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )local_48.Values.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,__pred);
                    local_68 = local_48.Values.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    if (_Var8._M_current ==
                        local_48.Values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
                      std::__cxx11::string::_M_assign(local_50);
                    }
                    else {
                      local_88._M_dataplus._M_p._0_1_ = 0x2e;
                      cmStrCat<char_const(&)[54],std::__cxx11::string&,char>
                                ((string *)local_b8,
                                 (char (*) [54])
                                 "command specified for \"VALIDATOR\" is not a function: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(lVar13 + local_d8._M_allocated_capacity),(char *)&local_88);
                      cmFindCommon::SetError(local_c0,(string *)local_b8);
                      if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
                        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
                      }
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_48.Values);
                    if ((code *)in_stack_ffffffffffffff18._M_p != (code *)0x0) {
                      (*(code *)in_stack_ffffffffffffff18._M_p)(&local_f8,&local_f8,3);
                    }
                    this_02 = local_90;
                    if (_Var8._M_current != local_68) goto LAB_006a36ac;
                  }
                  else {
                    bVar3 = cmFindCommon::CheckCommonArgument
                                      (local_c0,(string *)(local_d8._M_allocated_capacity + lVar13))
                    ;
                    if (bVar3) goto LAB_006a390e;
                    switch(uVar14) {
                    case 1:
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(local_60,(value_type *)(lVar13 + local_d8._M_allocated_capacity));
                      uVar14 = 1;
                      break;
                    case 2:
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(local_58,(value_type *)(lVar13 + local_d8._M_allocated_capacity));
                      uVar14 = 2;
                      break;
                    case 3:
                      cmFindCommon::AddPathSuffix
                                (local_c0,(string *)(lVar13 + local_d8._M_allocated_capacity));
                      uVar14 = 3;
                      break;
                    case 4:
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&local_c0->UserHintsArgs,
                                  (value_type *)(lVar13 + local_d8._M_allocated_capacity));
                      uVar14 = 4;
                    }
                  }
                }
              }
            }
            uVar15 = (ulong)(uVar12 + 1);
            uVar5 = (long)(local_d8._8_8_ - local_d8._0_8_) >> 5;
            bVar3 = uVar5 <= uVar15;
            this_03 = local_c0;
          } while (uVar15 < uVar5);
        }
        if ((this_02->VariableDocumentation)._M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)local_98,0,(char *)0x0,0x987c06);
          __rhs = (this_02->Names).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          pbVar2 = (this_02->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (__rhs == pbVar2) {
            std::__cxx11::string::append((char *)local_98);
          }
          else {
            if ((long)pbVar2 - (long)__rhs == 0x20) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b8,"the ",__rhs);
              plVar9 = (long *)std::__cxx11::string::append(local_b8);
              local_f8._M_unused._M_object = &stack0xffffffffffffff18;
              pvVar10 = (value_type *)(plVar9 + 2);
              if ((value_type *)*plVar9 == pvVar10) {
                _Var17._M_p = (pvVar10->_M_dataplus)._M_p;
              }
              else {
                _Var17._M_p = (pvVar10->_M_dataplus)._M_p;
                local_f8._M_unused._M_object = (value_type *)*plVar9;
              }
              local_f8._8_8_ = plVar9[1];
              *plVar9 = (long)pvVar10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_98,local_f8._M_unused._M_member_pointer)
              ;
            }
            else {
              std::__cxx11::string::append((char *)local_98);
              local_b8._0_8_ =
                   (this_02->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_b8._8_8_ =
                   (this_02->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              separator._M_str = ", ";
              separator._M_len = 2;
              cmJoin((string *)&local_f8,(cmStringRange *)local_b8,separator,(string_view)ZEXT816(0)
                    );
              std::__cxx11::string::_M_append((char *)local_98,local_f8._M_unused._M_member_pointer)
              ;
              if ((value_type *)local_f8._M_unused._0_8_ != (value_type *)&stack0xffffffffffffff18)
              {
                operator_delete(local_f8._M_unused._M_object,
                                (ulong)(in_stack_ffffffffffffff18._M_p + 1));
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_b8," or ",
                             (this_02->Names).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
              plVar9 = (long *)std::__cxx11::string::append(local_b8);
              pvVar10 = (value_type *)(plVar9 + 2);
              if ((value_type *)*plVar9 == pvVar10) {
                _Var17._M_p = (pvVar10->_M_dataplus)._M_p;
                local_f8._M_unused._M_object = (value_type *)&stack0xffffffffffffff18;
              }
              else {
                _Var17._M_p = (pvVar10->_M_dataplus)._M_p;
                local_f8._M_unused._M_object = (value_type *)*plVar9;
              }
              local_f8._8_8_ = plVar9[1];
              *plVar9 = (long)pvVar10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_98,local_f8._M_unused._M_member_pointer)
              ;
            }
            if ((value_type *)local_f8._M_unused._0_8_ != (value_type *)&stack0xffffffffffffff18) {
              operator_delete(local_f8._M_unused._M_object,(ulong)(_Var17._M_p + 1));
            }
            if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
              operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
            }
          }
        }
        if ((!bVar16) &&
           ((this_02->Names).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this_02->Names).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          __x = &this_02->Names;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_f8,__x);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_at_end(__x,(__x->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__x,(value_type *)local_f8._M_unused._0_8_);
          this_02 = local_90;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &(local_90->super_cmFindCommon).UserGuessArgs,
                     *(pointer *)
                      ((long)&(local_90->super_cmFindCommon).UserGuessArgs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 8),
                     (value_type *)(local_f8._M_unused._M_function_pointer + 0x20),local_f8._8_8_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_f8);
        }
        ExpandPaths(this_02);
        cmFindCommon::ComputeFinalPaths(this_03,Yes);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_d8);
  }
  return bVar3;
}

Assistant:

bool cmFindBase::ParseArguments(std::vector<std::string> const& argsIn)
{
  if (argsIn.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // copy argsIn into args so it can be modified,
  // in the process extract the DOC "documentation"
  // and handle options NO_CACHE and ENV
  size_t size = argsIn.size();
  std::vector<std::string> args;
  bool foundDoc = false;
  for (unsigned int j = 0; j < size; ++j) {
    if (foundDoc || argsIn[j] != "DOC") {
      if (argsIn[j] == "NO_CACHE") {
        this->StoreResultInCache = false;
      } else if (argsIn[j] == "ENV") {
        if (j + 1 < size) {
          j++;
          cmSystemTools::GetPath(args, argsIn[j].c_str());
        }
      } else {
        args.push_back(argsIn[j]);
      }
    } else {
      if (j + 1 < size) {
        foundDoc = true;
        this->VariableDocumentation = argsIn[j + 1];
        j++;
        if (j >= size) {
          break;
        }
      }
    }
  }
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  this->VariableName = args[0];
  if (this->CheckForVariableDefined()) {
    this->AlreadyDefined = true;
    return true;
  }

  // Find what search path locations have been enabled/disable
  this->SelectDefaultSearchModes();

  // Find the current root path mode.
  this->SelectDefaultRootPathMode();

  // Find the current bundle/framework search policy.
  this->SelectDefaultMacMode();

  bool newStyle = false;
  enum Doing
  {
    DoingNone,
    DoingNames,
    DoingPaths,
    DoingPathSuffixes,
    DoingHints
  };
  Doing doing = DoingNames; // assume it starts with a name
  for (unsigned int j = 1; j < args.size(); ++j) {
    if (args[j] == "NAMES") {
      doing = DoingNames;
      newStyle = true;
    } else if (args[j] == "PATHS") {
      doing = DoingPaths;
      newStyle = true;
    } else if (args[j] == "HINTS") {
      doing = DoingHints;
      newStyle = true;
    } else if (args[j] == "PATH_SUFFIXES") {
      doing = DoingPathSuffixes;
      newStyle = true;
    } else if (args[j] == "NAMES_PER_DIR") {
      doing = DoingNone;
      if (this->NamesPerDirAllowed) {
        this->NamesPerDir = true;
      } else {
        this->SetError("does not support NAMES_PER_DIR");
        return false;
      }
    } else if (args[j] == "NO_SYSTEM_PATH") {
      doing = DoingNone;
      this->NoDefaultPath = true;
    } else if (args[j] == "REQUIRED") {
      doing = DoingNone;
      this->Required = true;
      newStyle = true;
    } else if (args[j] == "REGISTRY_VIEW") {
      if (++j == args.size()) {
        this->SetError("missing required argument for \"REGISTRY_VIEW\"");
        return false;
      }
      auto view = cmWindowsRegistry::ToView(args[j]);
      if (view) {
        this->RegistryView = *view;
      } else {
        this->SetError(
          cmStrCat("given invalid value for \"REGISTRY_VIEW\": ", args[j]));
        return false;
      }
    } else if (args[j] == "VALIDATOR") {
      if (++j == args.size()) {
        this->SetError("missing required argument for \"VALIDATOR\"");
        return false;
      }
      auto command = this->Makefile->GetState()->GetCommand(args[j]);
      if (command == nullptr) {
        this->SetError(cmStrCat(
          "command specified for \"VALIDATOR\" is undefined: ", args[j], '.'));
        return false;
      }
      // ensure a macro is not specified as validator
      const auto& validatorName = args[j];
      cmList macros{ this->Makefile->GetProperty("MACROS") };
      if (std::find_if(macros.begin(), macros.end(),
                       [&validatorName](const std::string& item) {
                         return cmSystemTools::Strucmp(validatorName.c_str(),
                                                       item.c_str()) == 0;
                       }) != macros.end()) {
        this->SetError(cmStrCat(
          "command specified for \"VALIDATOR\" is not a function: ", args[j],
          '.'));
        return false;
      }
      this->ValidatorName = args[j];
    } else if (this->CheckCommonArgument(args[j])) {
      doing = DoingNone;
    } else {
      // Some common arguments were accidentally supported by CMake
      // 2.4 and 2.6.0 in the short-hand form of the command, so we
      // must support it even though it is not documented.
      if (doing == DoingNames) {
        this->Names.push_back(args[j]);
      } else if (doing == DoingPaths) {
        this->UserGuessArgs.push_back(args[j]);
      } else if (doing == DoingHints) {
        this->UserHintsArgs.push_back(args[j]);
      } else if (doing == DoingPathSuffixes) {
        this->AddPathSuffix(args[j]);
      }
    }
  }

  if (this->VariableDocumentation.empty()) {
    this->VariableDocumentation = "Where can ";
    if (this->Names.empty()) {
      this->VariableDocumentation += "the (unknown) library be found";
    } else if (this->Names.size() == 1) {
      this->VariableDocumentation +=
        "the " + this->Names.front() + " library be found";
    } else {
      this->VariableDocumentation += "one of the ";
      this->VariableDocumentation +=
        cmJoin(cmMakeRange(this->Names).retreat(1), ", ");
      this->VariableDocumentation +=
        " or " + this->Names.back() + " libraries be found";
    }
  }

  // look for old style
  // FIND_*(VAR name path1 path2 ...)
  if (!newStyle && !this->Names.empty()) {
    // All the short-hand arguments have been recorded as names.
    std::vector<std::string> shortArgs = this->Names;
    this->Names.clear(); // clear out any values in Names
    this->Names.push_back(shortArgs[0]);
    cm::append(this->UserGuessArgs, shortArgs.begin() + 1, shortArgs.end());
  }
  this->ExpandPaths();

  this->ComputeFinalPaths(IgnorePaths::Yes);

  return true;
}